

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O1

void __thiscall
MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenNames_,RefToken *token_,int lower,int upper_,bool matchNot)

{
  int iVar1;
  Ref *pRVar2;
  string local_60;
  RefToken *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Mismatched Token","");
  ParserException::ParserException(&this->super_ParserException,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_ParserException).super_ANTLRException =
       &PTR__MismatchedTokenException_00243cd8;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar2 = token_->ref;
  if (pRVar2 == (Ref *)0x0) {
    pRVar2 = (Ref *)0x0;
  }
  else {
    pRVar2->count = pRVar2->count + 1;
  }
  local_40 = &this->token;
  (this->token).ref = pRVar2;
  (this->node).ref = (Ref *)0x0;
  (this->tokenText)._M_dataplus._M_p = (pointer)&(this->tokenText).field_2;
  (this->tokenText)._M_string_length = 0;
  (this->tokenText).field_2._M_local_buf[0] = '\0';
  local_38 = &this->tokenNames;
  BitSet::BitSet(&this->set,0x40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->tokenNames,tokenNames_);
  iVar1 = (*local_40->ref->ptr->_vptr_Token[1])();
  (this->super_ParserException).line = iVar1;
  iVar1 = (**((this->token).ref)->ptr->_vptr_Token)();
  (this->super_ParserException).column = iVar1;
  (*((this->token).ref)->ptr->_vptr_Token[2])(&local_60);
  std::__cxx11::string::operator=((string *)&this->tokenText,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  this->expecting = lower;
  this->upper = upper_;
  this->mismatchType = matchNot + 3;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const std::vector<std::string>& tokenNames_,
	RefToken token_,
	int lower,
	int upper_,
	bool matchNot
) : ParserException("Mismatched Token")
  , token(token_)
  , node(0)
{
	tokenNames = tokenNames_;
	line = token->getLine();
	column = token->getColumn();
	tokenText = token->getText();
	expecting = lower;
	upper = upper_;
	mismatchType = matchNot ? NOT_RANGE : RANGE;
}